

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O0

gme_err_t gme_track_info(Music_Emu *me,gme_info_t **out,int track)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  gme_info_t *pgVar4;
  undefined8 *in_RSI;
  track_info_t *in_RDI;
  gme_err_t err;
  gme_info_t_ *info;
  gme_info_t *pgVar5;
  Gme_File *in_stack_fffffffffffffff8;
  char *pcVar6;
  
  *in_RSI = 0;
  pgVar4 = (gme_info_t *)gme_info_t_::operator_new(0x953558);
  pgVar5 = (gme_info_t *)0x0;
  if (pgVar4 != (gme_info_t *)0x0) {
    pgVar5 = pgVar4;
  }
  if (pgVar5 == (gme_info_t *)0x0) {
    pcVar6 = "Out of memory";
  }
  else {
    pgVar4 = pgVar5;
    pcVar6 = Gme_File::track_info(in_stack_fffffffffffffff8,in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (pcVar6 == (blargg_err_t)0x0) {
      uVar1 = pgVar5[1].loop_length;
      pgVar5->length = uVar1;
      uVar2 = pgVar5[1].i4;
      pgVar5->intro_length = uVar2;
      uVar3 = pgVar5[1].i6;
      pgVar5->loop_length = uVar3;
      pgVar5->i4 = -1;
      pgVar5->i5 = -1;
      pgVar5->i6 = -1;
      pgVar5->i7 = -1;
      pgVar5->i8 = -1;
      pgVar5->i9 = -1;
      pgVar5->i10 = -1;
      pgVar5->i11 = -1;
      pgVar5->i12 = -1;
      pgVar5->i13 = -1;
      pgVar5->i14 = -1;
      pgVar5->i15 = -1;
      pgVar5->s7 = "";
      pgVar5->s8 = "";
      pgVar5->s9 = "";
      pgVar5->s10 = "";
      pgVar5->s11 = "";
      pgVar5->s12 = "";
      pgVar5->s13 = "";
      pgVar5->s14 = "";
      pgVar5->s15 = "";
      pgVar5->system = (char *)&pgVar5[1].i8;
      pgVar5->game = (char *)&pgVar5[2].copyright;
      pgVar5->song = (char *)&pgVar5[3].s12;
      pgVar5->author = (char *)&pgVar5[5].i8;
      pgVar5->copyright = (char *)&pgVar5[6].copyright;
      pgVar5->comment = (char *)&pgVar5[7].s12;
      pgVar5->dumper = (char *)&pgVar5[9].i8;
      pgVar5->play_length = pgVar5->length;
      if ((pgVar5->play_length < 1) &&
         (pgVar5->play_length = pgVar5->intro_length + pgVar5->loop_length * 2,
         pgVar5->play_length < 1)) {
        pgVar5->play_length = 150000;
      }
      *in_RSI = pgVar5;
      pcVar6 = (blargg_err_t)0x0;
    }
    else {
      gme_free_info(pgVar4);
    }
  }
  return pcVar6;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_track_info( Music_Emu const* me, gme_info_t** out, int track )
{
	*out = NULL;
	
	gme_info_t_* info = BLARGG_NEW gme_info_t_;
	CHECK_ALLOC( info );
	
	gme_err_t err = me->track_info( &info->info, track );
	if ( err )
	{
		gme_free_info( info );
		return err;
	}
	
	#define COPY(name) info->name = info->info.name;
	
	COPY( length );
	COPY( intro_length );
	COPY( loop_length );
	
	info->i4  = -1;
	info->i5  = -1;
	info->i6  = -1;
	info->i7  = -1;
	info->i8  = -1;
	info->i9  = -1;
	info->i10 = -1;
	info->i11 = -1;
	info->i12 = -1;
	info->i13 = -1;
	info->i14 = -1;
	info->i15 = -1;
	
	info->s7  = "";
	info->s8  = "";
	info->s9  = "";
	info->s10 = "";
	info->s11 = "";
	info->s12 = "";
	info->s13 = "";
	info->s14 = "";
	info->s15 = "";
	
	COPY( system );
	COPY( game );
	COPY( song );
	COPY( author );
	COPY( copyright );
	COPY( comment );
	COPY( dumper );
	
	#undef COPY
	
	info->play_length = info->length;
	if ( info->play_length <= 0 )
	{
		info->play_length = info->intro_length + 2 * info->loop_length; // intro + 2 loops
		if ( info->play_length <= 0 )
			info->play_length = 150 * 1000; // 2.5 minutes
	}
	
	*out = info;
	
	return 0;
}